

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV2
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  char *pcVar1;
  undefined8 *puVar2;
  byte bVar3;
  ulong uVar4;
  complex<double> *pcVar5;
  ulong uVar6;
  complex<float> *pcVar7;
  float *pfVar8;
  uint *puVar9;
  int *piVar10;
  uchar *puVar11;
  unsigned_long *puVar12;
  long *plVar13;
  double *pdVar14;
  short *psVar15;
  unsigned_short *puVar16;
  longdouble *plVar17;
  char *pcVar18;
  IO *pIVar19;
  BP5Deserializer *pBVar20;
  undefined8 array_00;
  undefined8 uVar21;
  ostream *poVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  size_t sVar24;
  DataType type;
  DataType type_00;
  int iVar25;
  pointer pcVar26;
  adios2 *this_00;
  _Alloc_hider _Var27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  byte *pbVar31;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  string local_480;
  string local_460;
  BP5Deserializer *local_440;
  IO *local_438;
  allocator local_429;
  undefined1 local_428 [32];
  ulong *local_408;
  ulong local_400;
  char *local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_440 = this;
  local_408 = (ulong *)BaseData;
  if (*BaseData == 0) {
LAB_0060f72c:
    if (local_408[2] != 0) {
      uVar29 = 0;
      do {
        puVar2 = (undefined8 *)(local_408[3] + uVar29 * 0x18);
        pcVar1 = (char *)*puVar2 + 1;
        local_438 = (IO *)puVar2;
        if (*(char *)*puVar2 < 'C') {
          pIVar19 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar24 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar1,pcVar1 + sVar24);
          std::__cxx11::string::string
                    ((string *)&local_460,(char *)**(undefined8 **)((long)local_438 + 0x10),
                     &local_429);
          local_428._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_428 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar19,&local_480,&local_460,(string *)local_428,&local_70,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_428 + 0x10)) {
            operator_delete((void *)local_428._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p);
          }
        }
        else {
          local_428._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_428._8_8_ = (pointer)0x0;
          local_428._16_8_ = (pointer)0x0;
          local_400 = uVar29;
          local_3f8 = pcVar1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_428,puVar2[1]);
          if (puVar2[1] != 0) {
            lVar28 = puVar2[2];
            lVar30 = 0;
            uVar29 = 0;
            do {
              pcVar1 = *(char **)(lVar28 + uVar29 * 8);
              pcVar18 = *(char **)(local_428._0_8_ + lVar30 + 8);
              pcVar26 = (pointer)(local_428._0_8_ + lVar30);
              strlen(pcVar1);
              std::__cxx11::string::_M_replace((ulong)pcVar26,0,pcVar18,(ulong)pcVar1);
              uVar29 = uVar29 + 1;
              lVar30 = lVar30 + 0x20;
            } while (uVar29 < *(ulong *)((long)local_438 + 8));
          }
          pcVar1 = local_3f8;
          pIVar19 = local_440->m_Engine->m_IO;
          local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
          sVar24 = strlen(local_3f8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_480,pcVar1,pcVar1 + sVar24);
          uVar21 = local_428._8_8_;
          array_00 = local_428._0_8_;
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar19,&local_480,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)array_00,
                     (long)(uVar21 - array_00) >> 5,&local_460,&local_50,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar29 = local_400;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_460._M_dataplus._M_p != &local_460.field_2) {
            operator_delete(local_460._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_480._M_dataplus._M_p != &local_480.field_2) {
            operator_delete(local_480._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_428);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 < local_408[2]);
    }
switchD_0060e09a_caseD_52:
    return;
  }
  lVar28 = 0x10;
  uVar29 = 0;
LAB_0060e061:
  pBVar20 = local_440;
  uVar4 = local_408[1];
  pbVar31 = *(byte **)((uVar4 - 0x10) + lVar28);
  bVar3 = *pbVar31;
  iVar25 = (int)(char)bVar3;
  if (iVar25 < 0x43) {
    if (0xf < bVar3 - 0x31) {
switchD_0060e194_caseD_3e:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
      ToString_abi_cxx11_(&local_480,(adios2 *)(ulong)(iVar25 - 0x30),type_00);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_480._M_dataplus._M_p,
                           local_480._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar22);
      goto LAB_0060f700;
    }
    pbVar31 = pbVar31 + 1;
    switch((uint)bVar3) {
    case 0x31:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pcVar1 = *(char **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
      core::IO::DefineAttribute<signed_char>(pIVar19,&local_480,pcVar1,&local_460,&local_270,true);
      paVar23 = &local_270.field_2;
      _Var27._M_p = local_270._M_dataplus._M_p;
      break;
    case 0x32:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      psVar15 = *(short **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
      core::IO::DefineAttribute<short>(pIVar19,&local_480,psVar15,&local_460,&local_290,true);
      paVar23 = &local_290.field_2;
      _Var27._M_p = local_290._M_dataplus._M_p;
      break;
    case 0x33:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      piVar10 = *(int **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
      core::IO::DefineAttribute<int>(pIVar19,&local_480,piVar10,&local_460,&local_2b0,true);
      paVar23 = &local_2b0.field_2;
      _Var27._M_p = local_2b0._M_dataplus._M_p;
      break;
    case 0x34:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      plVar13 = *(long **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
      core::IO::DefineAttribute<long>(pIVar19,&local_480,plVar13,&local_460,&local_2d0,true);
      paVar23 = &local_2d0.field_2;
      _Var27._M_p = local_2d0._M_dataplus._M_p;
      break;
    case 0x35:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      puVar11 = *(uchar **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
      core::IO::DefineAttribute<unsigned_char>
                (pIVar19,&local_480,puVar11,&local_460,&local_2f0,true);
      paVar23 = &local_2f0.field_2;
      _Var27._M_p = local_2f0._M_dataplus._M_p;
      break;
    case 0x36:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      puVar16 = *(unsigned_short **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/","");
      core::IO::DefineAttribute<unsigned_short>
                (pIVar19,&local_480,puVar16,&local_460,&local_310,true);
      paVar23 = &local_310.field_2;
      _Var27._M_p = local_310._M_dataplus._M_p;
      break;
    case 0x37:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      puVar9 = *(uint **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"/","");
      core::IO::DefineAttribute<unsigned_int>(pIVar19,&local_480,puVar9,&local_460,&local_330,true);
      paVar23 = &local_330.field_2;
      _Var27._M_p = local_330._M_dataplus._M_p;
      break;
    case 0x38:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      puVar12 = *(unsigned_long **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"/","");
      core::IO::DefineAttribute<unsigned_long>
                (pIVar19,&local_480,puVar12,&local_460,&local_350,true);
      paVar23 = &local_350.field_2;
      _Var27._M_p = local_350._M_dataplus._M_p;
      break;
    case 0x39:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pfVar8 = *(float **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"/","");
      core::IO::DefineAttribute<float>(pIVar19,&local_480,pfVar8,&local_460,&local_370,true);
      paVar23 = &local_370.field_2;
      _Var27._M_p = local_370._M_dataplus._M_p;
      break;
    case 0x3a:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pdVar14 = *(double **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"/","");
      core::IO::DefineAttribute<double>(pIVar19,&local_480,pdVar14,&local_460,&local_390,true);
      paVar23 = &local_390.field_2;
      _Var27._M_p = local_390._M_dataplus._M_p;
      break;
    case 0x3b:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      plVar17 = *(longdouble **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"/","");
      core::IO::DefineAttribute<long_double>(pIVar19,&local_480,plVar17,&local_460,&local_3b0,true);
      paVar23 = &local_3b0.field_2;
      _Var27._M_p = local_3b0._M_dataplus._M_p;
      break;
    case 0x3c:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pcVar7 = *(complex<float> **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"/","");
      core::IO::DefineAttribute<std::complex<float>>
                (pIVar19,&local_480,pcVar7,&local_460,&local_3d0,true);
      paVar23 = &local_3d0.field_2;
      _Var27._M_p = local_3d0._M_dataplus._M_p;
      break;
    case 0x3d:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pcVar5 = *(complex<double> **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"/","");
      core::IO::DefineAttribute<std::complex<double>>
                (pIVar19,&local_480,pcVar5,&local_460,&local_3f0,true);
      paVar23 = &local_3f0.field_2;
      _Var27._M_p = local_3f0._M_dataplus._M_p;
      break;
    case 0x3e:
      goto switchD_0060e194_caseD_3e;
    case 0x3f:
      pIVar19 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      pcVar1 = *(char **)(uVar4 + lVar28);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
      core::IO::DefineAttribute<char>(pIVar19,&local_480,pcVar1,&local_460,&local_250,true);
      paVar23 = &local_250.field_2;
      _Var27._M_p = local_250._M_dataplus._M_p;
      break;
    case 0x40:
      goto switchD_0060e09a_caseD_52;
    }
  }
  else {
    this_00 = (adios2 *)(ulong)(iVar25 - 0x42);
    if (0xf < bVar3 - 0x43) {
switchD_0060e09a_caseD_50:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
      ToString_abi_cxx11_(&local_480,this_00,type);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_480._M_dataplus._M_p,
                           local_480._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar22);
      goto LAB_0060f700;
    }
    pbVar31 = pbVar31 + 1;
    switch((uint)bVar3) {
    case 0x43:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pcVar1 = *(char **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
      core::IO::DefineAttribute<signed_char>
                (local_438,&local_480,pcVar1,uVar6 / uVar4,&local_460,&local_b0,true);
      paVar23 = &local_b0.field_2;
      _Var27._M_p = local_b0._M_dataplus._M_p;
      break;
    case 0x44:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      psVar15 = *(short **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
      core::IO::DefineAttribute<short>
                (local_438,&local_480,psVar15,uVar6 / uVar4,&local_460,&local_d0,true);
      paVar23 = &local_d0.field_2;
      _Var27._M_p = local_d0._M_dataplus._M_p;
      break;
    case 0x45:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      piVar10 = *(int **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
      core::IO::DefineAttribute<int>
                (local_438,&local_480,piVar10,uVar6 / uVar4,&local_460,&local_f0,true);
      paVar23 = &local_f0.field_2;
      _Var27._M_p = local_f0._M_dataplus._M_p;
      break;
    case 0x46:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      plVar13 = *(long **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
      core::IO::DefineAttribute<long>
                (local_438,&local_480,plVar13,uVar6 / uVar4,&local_460,&local_110,true);
      paVar23 = &local_110.field_2;
      _Var27._M_p = local_110._M_dataplus._M_p;
      break;
    case 0x47:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      puVar11 = *(uchar **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
      core::IO::DefineAttribute<unsigned_char>
                (local_438,&local_480,puVar11,uVar6 / uVar4,&local_460,&local_130,true);
      paVar23 = &local_130.field_2;
      _Var27._M_p = local_130._M_dataplus._M_p;
      break;
    case 0x48:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      puVar16 = *(unsigned_short **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
      core::IO::DefineAttribute<unsigned_short>
                (local_438,&local_480,puVar16,uVar6 / uVar4,&local_460,&local_150,true);
      paVar23 = &local_150.field_2;
      _Var27._M_p = local_150._M_dataplus._M_p;
      break;
    case 0x49:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      puVar9 = *(uint **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
      core::IO::DefineAttribute<unsigned_int>
                (local_438,&local_480,puVar9,uVar6 / uVar4,&local_460,&local_170,true);
      paVar23 = &local_170.field_2;
      _Var27._M_p = local_170._M_dataplus._M_p;
      break;
    case 0x4a:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      puVar12 = *(unsigned_long **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
      core::IO::DefineAttribute<unsigned_long>
                (local_438,&local_480,puVar12,uVar6 / uVar4,&local_460,&local_190,true);
      paVar23 = &local_190.field_2;
      _Var27._M_p = local_190._M_dataplus._M_p;
      break;
    case 0x4b:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pfVar8 = *(float **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
      core::IO::DefineAttribute<float>
                (local_438,&local_480,pfVar8,uVar6 / uVar4,&local_460,&local_1b0,true);
      paVar23 = &local_1b0.field_2;
      _Var27._M_p = local_1b0._M_dataplus._M_p;
      break;
    case 0x4c:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pdVar14 = *(double **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
      core::IO::DefineAttribute<double>
                (local_438,&local_480,pdVar14,uVar6 / uVar4,&local_460,&local_1d0,true);
      paVar23 = &local_1d0.field_2;
      _Var27._M_p = local_1d0._M_dataplus._M_p;
      break;
    case 0x4d:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      plVar17 = *(longdouble **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
      core::IO::DefineAttribute<long_double>
                (local_438,&local_480,plVar17,uVar6 / uVar4,&local_460,&local_1f0,true);
      paVar23 = &local_1f0.field_2;
      _Var27._M_p = local_1f0._M_dataplus._M_p;
      break;
    case 0x4e:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pcVar7 = *(complex<float> **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
      core::IO::DefineAttribute<std::complex<float>>
                (local_438,&local_480,pcVar7,uVar6 / uVar4,&local_460,&local_210,true);
      paVar23 = &local_210.field_2;
      _Var27._M_p = local_210._M_dataplus._M_p;
      break;
    case 0x4f:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pcVar5 = *(complex<double> **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
      core::IO::DefineAttribute<std::complex<double>>
                (local_438,&local_480,pcVar5,uVar6 / uVar4,&local_460,&local_230,true);
      paVar23 = &local_230.field_2;
      _Var27._M_p = local_230._M_dataplus._M_p;
      break;
    case 0x50:
      goto switchD_0060e09a_caseD_50;
    case 0x51:
      local_438 = local_440->m_Engine->m_IO;
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      sVar24 = strlen((char *)pbVar31);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,pbVar31,pbVar31 + sVar24)
      ;
      uVar6 = *(ulong *)((uVar4 - 8) + lVar28);
      pcVar1 = *(char **)(uVar4 + lVar28);
      uVar4 = *(ulong *)((long)&pBVar20->_vptr_BP5Deserializer +
                        (long)(pBVar20->_vptr_BP5Deserializer[-3] + (long)this_00 * 8));
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
      core::IO::DefineAttribute<char>
                (local_438,&local_480,pcVar1,uVar6 / uVar4,&local_460,&local_90,true);
      paVar23 = &local_90.field_2;
      _Var27._M_p = local_90._M_dataplus._M_p;
      break;
    case 0x52:
      goto switchD_0060e09a_caseD_52;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var27._M_p != paVar23) {
    operator_delete(_Var27._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
LAB_0060f700:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p);
  }
  uVar29 = uVar29 + 1;
  lVar28 = lVar28 + 0x18;
  if (*local_408 <= uVar29) goto LAB_0060f72c;
  goto LAB_0060e061;
}

Assistant:

void BP5Deserializer::InstallAttributesV2(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    BP5AttrStruct *Attrs = (BP5AttrStruct *)BaseData;

    auto lf_BreakdownTypeArray = [](const char *Name, DataType &Type, bool &Array) {
        Type = (DataType)(Name[0] - '0');
        Array = false;
        if ((int)Type > 18)
        {
            Type = (DataType)((int)Type - 18);
            Array = true;
        }
    };

    for (size_t i = 0; i < Attrs->PrimAttrCount; i++)
    {
        PrimitiveTypeAttr *ThisAttr = &Attrs->PrimAttrs[i];
        bool Array;
        DataType Type;
        lf_BreakdownTypeArray(ThisAttr->Name, Type, Array);
        const char *Name = &ThisAttr->Name[1];
        if (Array)
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, (T *)ThisAttr->Values,                             \
                                          ThisAttr->TotalElementSize / DataTypeSize[(int)Type],    \
                                          "", "/", true);                                          \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
        else
        {
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(Name, *(T *)ThisAttr->Values, "", "/", true);            \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
        }
    }